

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# animation.cpp
# Opt level: O2

int main(void)

{
  GenericPoint<float> GVar1;
  Sizef SVar2;
  reference rVar3;
  bool bVar4;
  RealCanvas<plot::BrailleCanvas> *pRVar5;
  ostream *poVar6;
  float fVar7;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dc_00;
  undefined4 extraout_XMM0_Dc_01;
  undefined4 extraout_XMM0_Dc_02;
  undefined4 extraout_XMM0_Dd;
  undefined4 extraout_XMM0_Dd_00;
  undefined4 extraout_XMM0_Dd_01;
  undefined4 extraout_XMM0_Dd_02;
  Rectf bnds;
  Size SVar8;
  float local_30c;
  undefined1 local_308 [8];
  undefined4 uStack_300;
  undefined4 uStack_2fc;
  anon_class_8_2_94730b2a cos;
  anon_class_8_2_94730b2a sin;
  float local_2e8;
  float local_2d8;
  const_iterator __begin2;
  range_iterator<float> rng;
  const_iterator __end2;
  TerminalInfo term;
  RealCanvas<plot::BrailleCanvas> canvas;
  Margin<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_> local_118;
  
  signal(2,main::anon_class_1_0_00000001::__invoke);
  term.mode = None;
  term.foreground_color.r = 0.9;
  term.foreground_color.g = 0.9;
  term.foreground_color.b = 0.9;
  term.foreground_color.a = 1.0;
  term.background_color.r = 0.0;
  term.background_color.g = 0.0;
  term.background_color.b = 0.0;
  term.background_color.a = 1.0;
  term.term_ = 1;
  plot::TerminalInfo::detect<void>(&term);
  local_118.top_ = 0x1e;
  local_118.right_ = 7;
  bnds.p2.x = 1.0;
  bnds.p2.y = -1.0;
  bnds.p1.x = 0.0;
  bnds.p1.y = 1.0;
  plot::RealCanvas<plot::BrailleCanvas>::RealCanvas<plot::GenericPoint<long>,plot::TerminalInfo&>
            (&canvas,bnds,(GenericPoint<long> *)&local_118,&term);
  local_118.block_.term_.term_ = term.term_;
  local_118.block_.term_.background_color.a = term.background_color.a;
  local_118.block_.term_.foreground_color.r = term.foreground_color.r;
  local_118.block_.term_.mode = term.mode;
  local_118.block_.term_.foreground_color.b = term.foreground_color.b;
  local_118.block_.term_.foreground_color.g = term.foreground_color.g;
  local_118.block_.term_.background_color.r = term.background_color.r;
  local_118.block_.term_.foreground_color.a = term.foreground_color.a;
  local_118.block_.term_.background_color.b = term.background_color.b;
  local_118.block_.term_.background_color.g = term.background_color.g;
  local_118.block_.label_._M_len = 0;
  local_118.block_.label_._M_str = (char *)0x0;
  local_118.block_.align_ = Left;
  local_118.block_.border_.top_left._M_len = 3;
  local_118.block_.border_.top_left._M_str = anon_var_dwarf_90e0;
  local_118.block_.border_.top._M_len = 3;
  local_118.block_.border_.top._M_str = anon_var_dwarf_900b;
  local_118.block_.border_.top_right._M_len = 3;
  local_118.block_.border_.top_right._M_str = anon_var_dwarf_90f5;
  local_118.block_.border_.left._M_len = 3;
  local_118.block_.border_.left._M_str = anon_var_dwarf_9017;
  local_118.block_.border_.right._M_len = 3;
  local_118.block_.border_.right._M_str = anon_var_dwarf_9017;
  local_118.block_.border_.bottom_left._M_len = 3;
  local_118.block_.border_.bottom_left._M_str = anon_var_dwarf_910a;
  local_118.block_.border_.bottom._M_len = 3;
  local_118.block_.border_.bottom._M_str = anon_var_dwarf_900b;
  local_118.block_.border_.bottom_right._M_len = 3;
  local_118.block_.border_.bottom_right._M_str = anon_var_dwarf_911f;
  local_118.top_ = 1;
  local_118.right_ = 2;
  local_118.bottom_ = 1;
  local_118.left_ = 2;
  local_118.block_.block_ = &canvas;
  GVar1 = plot::GenericRect<float>::size(&canvas.bounds_);
  __begin2.line_.margin_ = (Margin<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_> *)0x1;
  __begin2.line_.overflow_ = 1;
  SVar2 = plot::RealCanvas<plot::BrailleCanvas>::unmap_size(&canvas,(size_type *)&__begin2);
  local_308._4_4_ = GVar1.y;
  cos.A = (float)local_308._4_4_ * 0.5;
  sin.f = 2.0;
  cos.f = 2.0;
  local_2e8 = canvas.bounds_.p2.x;
  local_2d8 = canvas.bounds_.p1.x;
  sin.A = cos.A;
  range_iterator<float>::range_iterator(&rng,local_2d8,SVar2.x + local_2e8,SVar2.x);
  local_30c = 0.0;
  while( true ) {
    plot::detail::braille::image_t::clear(&canvas.canvas_.blocks_);
    __begin2.line_.margin_ =
         (Margin<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_> *)rng._0_8_;
    __begin2.line_.overflow_._0_4_ = rng.step_;
    __begin2.line_.overflow_._4_1_ = rng.is_end;
    __begin2.line_.overflow_._5_3_ = rng._13_3_;
    __begin2.line_.line_.line_.frame_ = (Frame<plot::RealCanvas<plot::BrailleCanvas>_*> *)&sin;
    __begin2.line_.line_.line_.overflow_ =
         CONCAT44(__begin2.line_.line_.line_.overflow_._4_4_,local_30c);
    plot::BrailleCanvas::push(&canvas.canvas_);
    rVar3 = map_iterator<range_iterator<float>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/fbbdev[P]plot/examples/animation.cpp:67:16)>
            ::operator*((map_iterator<range_iterator<float>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_fbbdev[P]plot_examples_animation_cpp:67:16)>
                         *)&__begin2.line_);
    uStack_300 = extraout_XMM0_Dc;
    local_308._0_4_ = rVar3.x;
    local_308._4_4_ = rVar3.y;
    uStack_2fc = extraout_XMM0_Dd;
    while( true ) {
      std::__advance<range_iterator<float>,long>(&__begin2.line_,1);
      if ((__begin2.line_.overflow_._4_1_ != '\0') ||
         ((((__begin2.line_.margin_._0_4_ == 0.0 && (!NAN(__begin2.line_.margin_._0_4_))) &&
           (__begin2.line_.margin_._4_4_ == 0.0)) &&
          (((!NAN(__begin2.line_.margin_._4_4_) && ((float)__begin2.line_.overflow_ == 0.0)) &&
           (!NAN((float)__begin2.line_.overflow_))))))) break;
      rVar3 = map_iterator<range_iterator<float>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/fbbdev[P]plot/examples/animation.cpp:67:16)>
              ::operator*((map_iterator<range_iterator<float>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_fbbdev[P]plot_examples_animation_cpp:67:16)>
                           *)&__begin2.line_);
      plot::RealCanvas<plot::BrailleCanvas>::line<>
                (&canvas,(Color *)plot::palette::royalblue,(Pointf)local_308,rVar3);
      uStack_300 = extraout_XMM0_Dc_00;
      local_308._0_4_ = rVar3.x;
      local_308._4_4_ = rVar3.y;
      uStack_2fc = extraout_XMM0_Dd_00;
    }
    pRVar5 = plot::RealCanvas<plot::BrailleCanvas>::pop<>(&canvas);
    __begin2.line_.margin_ =
         (Margin<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_> *)rng._0_8_;
    __begin2.line_.overflow_._0_4_ = rng.step_;
    __begin2.line_.overflow_._4_1_ = rng.is_end;
    __begin2.line_.overflow_._5_3_ = rng._13_3_;
    __begin2.line_.line_.line_.frame_ = (Frame<plot::RealCanvas<plot::BrailleCanvas>_*> *)&cos;
    __begin2.line_.line_.line_.overflow_ =
         CONCAT44(__begin2.line_.line_.line_.overflow_._4_4_,local_30c);
    plot::BrailleCanvas::push(&pRVar5->canvas_);
    rVar3 = map_iterator<range_iterator<float>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/fbbdev[P]plot/examples/animation.cpp:67:16)>
            ::operator*((map_iterator<range_iterator<float>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_fbbdev[P]plot_examples_animation_cpp:67:16)>
                         *)&__begin2.line_);
    uStack_300 = extraout_XMM0_Dc_01;
    local_308._0_4_ = rVar3.x;
    local_308._4_4_ = rVar3.y;
    uStack_2fc = extraout_XMM0_Dd_01;
    while( true ) {
      std::__advance<range_iterator<float>,long>(&__begin2.line_,1);
      if ((__begin2.line_.overflow_._4_1_ != '\0') ||
         (((__begin2.line_.margin_._0_4_ == 0.0 && (!NAN(__begin2.line_.margin_._0_4_))) &&
          ((__begin2.line_.margin_._4_4_ == 0.0 &&
           (((!NAN(__begin2.line_.margin_._4_4_) && ((float)__begin2.line_.overflow_ == 0.0)) &&
            (!NAN((float)__begin2.line_.overflow_))))))))) break;
      rVar3 = map_iterator<range_iterator<float>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/fbbdev[P]plot/examples/animation.cpp:67:16)>
              ::operator*((map_iterator<range_iterator<float>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_fbbdev[P]plot_examples_animation_cpp:67:16)>
                           *)&__begin2.line_);
      plot::RealCanvas<plot::BrailleCanvas>::line<>
                (pRVar5,(Color *)plot::palette::red,(Pointf)local_308,rVar3);
      uStack_300 = extraout_XMM0_Dc_02;
      local_308._0_4_ = rVar3.x;
      local_308._4_4_ = rVar3.y;
      uStack_2fc = extraout_XMM0_Dd_02;
    }
    pRVar5 = plot::RealCanvas<plot::BrailleCanvas>::pop<>(pRVar5);
    __begin2.line_.margin_ =
         (Margin<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_> *)
         CONCAT44(__begin2.line_.margin_._4_4_,2);
    plot::RealCanvas<plot::BrailleCanvas>::line<plot::TerminalOp>
              (pRVar5,&term.foreground_color,(Pointf)((ulong)canvas.bounds_.p1 & 0xffffffff),
               (Pointf)((ulong)canvas.bounds_.p2 & 0xffffffff),(TerminalOp *)&__begin2.line_);
    __begin2.line_.overflow_ = -local_118.top_;
    __begin2.line_.line_.line_.line_.line_.it_._M_current =
         ((local_118.block_.block_)->canvas_).blocks_.
         super_vector<plot::detail::braille::block_t,_std::allocator<plot::detail::braille::block_t>_>
         .
         super__Vector_base<plot::detail::braille::block_t,_std::allocator<plot::detail::braille::block_t>_>
         ._M_impl.super__Vector_impl_data._M_start;
    __begin2.line_.line_.line_.end_.line_.it_._M_current =
         ((local_118.block_.block_)->canvas_).blocks_.
         super_vector<plot::detail::braille::block_t,_std::allocator<plot::detail::braille::block_t>_>
         .
         super__Vector_base<plot::detail::braille::block_t,_std::allocator<plot::detail::braille::block_t>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    __begin2.line_.margin_ = &local_118;
    __begin2.line_.line_.line_.frame_ = &local_118.block_;
    __begin2.line_.line_.line_.overflow_ = -1;
    __begin2.line_.line_.line_.line_.line_.canvas_ = &(local_118.block_.block_)->canvas_;
    __begin2.line_.end_.line_.overflow_ = 1;
    __end2.line_.line_.line_.line_.line_.it_._M_current =
         ((local_118.block_.block_)->canvas_).blocks_.
         super_vector<plot::detail::braille::block_t,_std::allocator<plot::detail::braille::block_t>_>
         .
         super__Vector_base<plot::detail::braille::block_t,_std::allocator<plot::detail::braille::block_t>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    __end2.line_.overflow_ = local_118.bottom_;
    __end2.line_.line_.line_.overflow_ = 1;
    __end2.line_.end_.line_.overflow_ = 1;
    __begin2.line_.line_.line_.end_.line_.canvas_ = __begin2.line_.line_.line_.line_.line_.canvas_;
    __begin2.line_.end_.line_.frame_ = __begin2.line_.line_.line_.frame_;
    __begin2.line_.end_.line_.line_.line_.canvas_ = __begin2.line_.line_.line_.line_.line_.canvas_;
    __begin2.line_.end_.line_.line_.line_.it_._M_current =
         __begin2.line_.line_.line_.end_.line_.it_._M_current;
    __begin2.line_.end_.line_.end_.line_.canvas_ = __begin2.line_.line_.line_.line_.line_.canvas_;
    __begin2.line_.end_.line_.end_.line_.it_._M_current =
         __begin2.line_.line_.line_.end_.line_.it_._M_current;
    __end2.line_.margin_ = __begin2.line_.margin_;
    __end2.line_.line_.line_.frame_ = __begin2.line_.line_.line_.frame_;
    __end2.line_.line_.line_.line_.line_.canvas_ = __begin2.line_.line_.line_.line_.line_.canvas_;
    __end2.line_.line_.line_.end_.line_.canvas_ = __begin2.line_.line_.line_.line_.line_.canvas_;
    __end2.line_.line_.line_.end_.line_.it_._M_current =
         __end2.line_.line_.line_.line_.line_.it_._M_current;
    __end2.line_.end_.line_.frame_ = __begin2.line_.line_.line_.frame_;
    __end2.line_.end_.line_.line_.line_.canvas_ = __begin2.line_.line_.line_.line_.line_.canvas_;
    __end2.line_.end_.line_.line_.line_.it_._M_current =
         __end2.line_.line_.line_.line_.line_.it_._M_current;
    __end2.line_.end_.line_.end_.line_.canvas_ = __begin2.line_.line_.line_.line_.line_.canvas_;
    __end2.line_.end_.line_.end_.line_.it_._M_current =
         __end2.line_.line_.line_.line_.line_.it_._M_current;
    while( true ) {
      bVar4 = plot::detail::
              block_iterator<plot::Margin<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::margin_line<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
              ::operator!=((block_iterator<plot::Margin<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::margin_line<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
                            *)&__begin2.line_,&__end2);
      if (!bVar4) break;
      if ((term.mode != None) && (term.mode != Windows)) {
        plot::ansi::clear_line((ostream *)&std::cout);
      }
      poVar6 = plot::detail::operator<<((ostream *)&std::cout,&__begin2.line_);
      std::operator<<(poVar6,'\n');
      plot::detail::
      block_iterator<plot::Margin<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::margin_line<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
      ::operator++((block_iterator<plot::Margin<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::margin_line<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
                    *)&__begin2.line_);
    }
    std::ostream::flush();
    if (run == 0) break;
    __begin2.line_.margin_ = (Margin<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_> *)0x28;
    std::this_thread::sleep_for<long,std::ratio<1l,1000l>>
              ((duration<long,_std::ratio<1L,_1000L>_> *)&__begin2.line_);
    if (run == 0) break;
    local_30c = local_30c + 0.01;
    if (1.0 <= local_30c) {
      fVar7 = truncf(local_30c);
      local_30c = local_30c - fVar7;
    }
    SVar8 = plot::Margin<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>::size(&local_118);
    __begin2.line_.margin_ =
         (Margin<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_> *)(ulong)term.mode;
    __begin2.line_.overflow_ = CONCAT44(__begin2.line_.overflow_._4_4_,(int)SVar8.y);
    plot::detail::operator<<
              ((ostream *)&std::cout,
               (ansi_manip_wrapper<plot::ansi::detail::cursor_move> *)&__begin2.line_);
    std::ostream::flush();
  }
  plot::BrailleCanvas::~BrailleCanvas(&canvas.canvas_);
  return 0;
}

Assistant:

int main() {
    std::signal(SIGINT, [](int) {
        run = false;
    });

    TerminalInfo term;
    term.detect();

    RealCanvas<BrailleCanvas> canvas({ { 0.0f, 1.0f }, { 1.0f, -1.0f } }, Size(30, 7), term);
    auto layout = margin(frame(&canvas, term));

    auto bounds = canvas.bounds();
    auto size = canvas.size();
    auto pixel = canvas.unmap_size({ 1, 1 });

    float A = size.y/2.0f;
    float f = 2.0f;

    auto sin = [A,f](float t) {
        return A*std::sin(2*3.141592f*f*t);
    };

    auto cos = [A,f](float t) {
        return A*std::cos(2*3.141592f*f*t);
    };

    auto plot_fn = [](auto const& fn, float t_) {
        return [&fn, t_](float x) -> Pointf {
            return { x, fn(t_ + x) };
        };
    };

    // Plot function in range [bounds.p1.x, bounds.p2.x] with step of 1px
    // Actually, the range is [bounds.p1.x, bounds.p2.x + 1px)
    range_iterator<float> rng(bounds.p1.x, bounds.p2.x + pixel.x, pixel.x);
    range_iterator<float> rng_end;

    float t = 0.0f;

    while (true) {
        canvas.clear()
              .path(palette::royalblue, map(rng, plot_fn(sin, t)), map(rng_end, plot_fn(sin, t)))
              .path(palette::red, map(rng, plot_fn(cos, t)), map(rng_end, plot_fn(cos, t)))
              .line(term.foreground_color, { bounds.p1.x, 0.0f }, { bounds.p2.x, 0.0f }, TerminalOp::ClipSrc);

        for (auto const& line: layout)
            std::cout << term.clear_line() << line << '\n';

        std::cout << std::flush;

        if (!run)
            break;

        using namespace std::chrono_literals;
        std::this_thread::sleep_for(40ms);

        if (!run)
            break;

        t += 0.01f;
        if (t >= 1.0f)
            t -= std::trunc(t);

        std::cout << term.move_up(layout.size().y) << std::flush;
    }

    return 0;
}